

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryFuncs.cpp
# Opt level: O0

void __thiscall slang::ast::builtins::SizeFunction::SizeFunction(SizeFunction *this)

{
  ArrayQueryFunction *in_RDI;
  SubroutineKind in_stack_ffffffffffffffe8;
  KnownSystemName in_stack_ffffffffffffffec;
  
  ArrayQueryFunction::SystemSubroutine(in_RDI,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8);
  (in_RDI->super_SystemSubroutine)._vptr_SystemSubroutine =
       (_func_int **)&PTR__SizeFunction_00ddc888;
  return;
}

Assistant:

ConstantValue LowFunction::eval(EvalContext& context, const Args& args, SourceRange,
                                const CallExpression::SystemCallInfo&) const {
    DimResult dim = getDim(context, args);
    if (dim.hardFail)
        return nullptr;

    if (dim.outOfRange)
        return SVInt::createFillX(32, true);

    if (dim.isDynamic)
        return SVInt(32, 0, true);

    // For associative arrays, $low returns the first key, or 'x if no elements.
    if (dim.indexType) {
        if (dim.map.empty())
            return SVInt::createFillX(dim.indexType->getBitWidth(), dim.indexType->isSigned());
        return dim.map.begin()->first;
    }

    return SVInt(32, uint64_t(dim.range.lower()), true);
}